

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O2

void __thiscall Game::GameBoard::GameBoard(GameBoard *this,ull playsize)

{
  allocator_type local_31;
  _Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> local_30;
  
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_30,playsize * playsize,
             &local_31);
  GameBoard(this,playsize,(tile_data_array_t *)&local_30);
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

GameBoard::GameBoard(ull playsize)
    : GameBoard{playsize, tile_data_array_t(playsize * playsize)} {
}